

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O0

bool __thiscall
Am_Button_Panel_Text_Info::Am_Button_Panel_Text_Navigate::Move
          (Am_Button_Panel_Text_Navigate *this,Am_Inplace_Text_Direction direction)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Value_List local_30 [8];
  Am_Value_List parts;
  Am_Inplace_Text_Direction direction_local;
  Am_Button_Panel_Text_Navigate *this_local;
  
  pAVar2 = (Am_Value *)Am_Object::Get((short)this->info + 0x18,0x82);
  Am_Value_List::Am_Value_List(local_30,pAVar2);
  Am_Value_List::Start();
  Am_Object::operator_cast_to_Am_Wrapper_(&this->info->current_button);
  bVar1 = Am_Value_List::Member((Am_Wrapper *)local_30);
  if ((bVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    switch(direction) {
    case Am_INPLACE_UP:
    case Am_INPLACE_LEFT:
      Am_Value_List::Prev();
      bVar1 = Am_Value_List::First();
      if ((bVar1 & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0010ae64;
      }
      break;
    case Am_INPLACE_DOWN:
    case Am_INPLACE_RIGHT:
      Am_Value_List::Next();
      bVar1 = Am_Value_List::Last();
      if ((bVar1 & 1) != 0) {
        this_local._7_1_ = false;
        goto LAB_0010ae64;
      }
      break;
    case Am_INPLACE_PREV:
      Am_Value_List::Prev();
      bVar1 = Am_Value_List::First();
      if ((bVar1 & 1) != 0) {
        Am_Value_List::End();
      }
      break;
    case Am_INPLACE_NEXT:
      Am_Value_List::Next();
      bVar1 = Am_Value_List::Last();
      if ((bVar1 & 1) != 0) {
        Am_Value_List::Start();
      }
    }
    pAVar2 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&this->info->current_button,pAVar2);
    this_local._7_1_ = true;
  }
LAB_0010ae64:
  Am_Value_List::~Am_Value_List(local_30);
  return this_local._7_1_;
}

Assistant:

bool Move(Am_Inplace_Text_Direction direction) override
    {
      Am_Value_List parts = info->self.Get(Am_GRAPHICAL_PARTS);
      parts.Start();
      if (!parts.Member(info->current_button))
        return false;
      switch (direction) {
      case Am_INPLACE_PREV:
        parts.Prev();
        if (parts.First())
          parts.End();
        break;
      case Am_INPLACE_LEFT:
      case Am_INPLACE_UP:
        parts.Prev();
        if (parts.First())
          return false;
        break;
      case Am_INPLACE_NEXT:
        parts.Next();
        if (parts.Last())
          parts.Start();
        break;
      case Am_INPLACE_RIGHT:
      case Am_INPLACE_DOWN:
        parts.Next();
        if (parts.Last())
          return false;
        break;
      }
      info->current_button = parts.Get();
      return true;
    }